

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O1

void __thiscall
QMarkdownTextEdit::QMarkdownTextEdit(QMarkdownTextEdit *this,QWidget *parent,bool initHighlighter)

{
  int iVar1;
  QObject *pQVar2;
  LineNumArea *this_00;
  MarkdownHighlighter *this_01;
  QTextDocument *parent_00;
  QVBoxLayout *this_02;
  QPlainTextEditSearchWidget *this_03;
  QWidget *pQVar3;
  undefined4 *puVar4;
  void **ppvVar5;
  QSlotObjectBase *pQVar6;
  QMarkdownTextEdit *pQVar7;
  code *local_a0;
  undefined8 local_98;
  code *local_90;
  ImplFn local_88;
  QFontMetrics metrics;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QFont font;
  
  QPlainTextEdit::QPlainTextEdit(&this->super_QPlainTextEdit,parent);
  *(undefined ***)this = &PTR_metaObject_0015e6b0;
  *(undefined ***)&this->field_0x10 = &PTR__QMarkdownTextEdit_0015e8b8;
  QTextCursor::QTextCursor(&this->_textCursor);
  this->_highlighter = (MarkdownHighlighter *)0x0;
  (this->_ignoredClickUrlSchemata).d.d = (Data *)0x0;
  (this->_ignoredClickUrlSchemata).d.ptr = (QString *)0x0;
  (this->_ignoredClickUrlSchemata).d.size = 0;
  (this->_currentLineHighlightColor).cspec = Invalid;
  (this->_autoTextOptions).i = 0;
  *(undefined4 *)((long)&(this->_autoTextOptions).i + 3) = 0;
  (this->_currentLineHighlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->_currentLineHighlightColor).ct + 2) = 0;
  this->_debounceDelay = 0;
  this->_lineNumberLeftMarginOffset = 0;
  QObject::installEventFilter((QObject *)this);
  pQVar2 = (QObject *)QAbstractScrollArea::viewport();
  QObject::installEventFilter(pQVar2);
  (this->_autoTextOptions).i = 1;
  this_00 = (LineNumArea *)operator_new(0x58);
  pQVar7 = this;
  LineNumArea::LineNumArea(this_00,this);
  this->_lineNumArea = this_00;
  updateLineNumberAreaWidth(this,(int)pQVar7);
  this->_highlightingEnabled = initHighlighter;
  if (initHighlighter) {
    this_01 = (MarkdownHighlighter *)operator_new(0x58);
    parent_00 = (QTextDocument *)QPlainTextEdit::document();
    MarkdownHighlighter::MarkdownHighlighter(this_01,parent_00,(HighlightingOptions)0x0);
    this->_highlighter = this_01;
  }
  QFont::QFont(&font,(QFont *)(*(long *)&this->field_0x20 + 0x38));
  QFontMetrics::QFontMetrics(&metrics,&font);
  iVar1 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&metrics);
  QPlainTextEdit::setTabStopDistance((double)(iVar1 << 2));
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,(QWidget *)this);
  QLayout::setContentsMargins((int)this_02,0,0,0);
  QBoxLayout::addStretch((int)this_02);
  QWidget::setLayout((QLayout *)this);
  this_03 = (QPlainTextEditSearchWidget *)operator_new(0x98);
  QPlainTextEditSearchWidget::QPlainTextEditSearchWidget
            ((QPlainTextEditSearchWidget *)this_03,&this->super_QPlainTextEdit);
  this->_searchWidget = this_03;
  pQVar3 = (QWidget *)QWidget::layout();
  QLayout::addWidget(pQVar3);
  local_a0 = QPlainTextEdit::textChanged;
  local_98 = 0;
  local_90 = adjustRightMargin;
  local_88 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QMarkdownTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = adjustRightMargin;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)this,(QObject *)&local_a0,(void **)this,(QSlotObjectBase *)&local_90,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_a0 = QPlainTextEdit::cursorPositionChanged;
  local_98 = 0;
  local_90 = centerTheCursor;
  local_88 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QMarkdownTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar4 + 4) = centerTheCursor;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)this,(QObject *)&local_a0,(void **)this,(QSlotObjectBase *)&local_90,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  ppvVar5 = (void **)QAbstractScrollArea::verticalScrollBar();
  local_a0 = QAbstractSlider::valueChanged;
  local_98 = 0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]qt-markdown-textedit/qmarkdowntextedit.cpp:88:67),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(QMarkdownTextEdit **)(puVar4 + 4) = this;
  QObject::connectImpl
            (local_58,ppvVar5,(QObject *)&local_a0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  local_a0 = QPlainTextEdit::cursorPositionChanged;
  local_98 = 0;
  puVar4 = (undefined4 *)operator_new(0x18);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]qt-markdown-textedit/qmarkdowntextedit.cpp:91:65),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(QMarkdownTextEdit **)(puVar4 + 4) = this;
  QObject::connectImpl
            (local_60,(void **)this,(QObject *)&local_a0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  ppvVar5 = (void **)QPlainTextEdit::document();
  local_a0 = QTextDocument::blockCountChanged;
  local_98 = 0;
  local_90 = updateLineNumberAreaWidth;
  local_88 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::QSlotObject<void_(QMarkdownTextEdit::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar4 + 4) = updateLineNumberAreaWidth;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_68,ppvVar5,(QObject *)&local_a0,(void **)this,(QSlotObjectBase *)&local_90,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  local_a0 = QPlainTextEdit::updateRequest;
  local_98 = 0;
  local_90 = updateLineNumberArea;
  local_88 = (ImplFn)0x0;
  puVar4 = (undefined4 *)operator_new(0x20);
  *puVar4 = 1;
  *(code **)(puVar4 + 2) =
       QtPrivate::
       QSlotObject<void_(QMarkdownTextEdit::*)(QRect,_int),_QtPrivate::List<const_QRect_&,_int>,_void>
       ::impl;
  *(code **)(puVar4 + 4) = updateLineNumberArea;
  *(undefined8 *)(puVar4 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)this,(QObject *)&local_a0,(void **)this,(QSlotObjectBase *)&local_90,
             (ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QPlainTextEditSearchWidget::setDebounceDelay
            ((QPlainTextEditSearchWidget *)this->_searchWidget,this->_debounceDelay);
  QPlainTextEdit::setCenterOnScroll(SUB81(this,0));
  pQVar6 = (QSlotObjectBase *)operator_new(0x20);
  (pQVar6->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  pQVar6->m_impl =
       QtPrivate::QSlotObject<void_(QMarkdownTextEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(pQVar6 + 1) = adjustRightMargin;
  pQVar6[1].m_impl = (ImplFn)0x0;
  QTimer::singleShotImpl(300,PreciseTimer,(QObject *)this,pQVar6);
  QFontMetrics::~QFontMetrics(&metrics);
  QFont::~QFont(&font);
  return;
}

Assistant:

QMarkdownTextEdit::QMarkdownTextEdit(QWidget *parent, bool initHighlighter)
    : QPlainTextEdit(parent) {
    installEventFilter(this);
    viewport()->installEventFilter(this);
    _autoTextOptions = AutoTextOption::BracketClosing;

    _lineNumArea = new LineNumArea(this);
    updateLineNumberAreaWidth(0);

    // markdown highlighting is enabled by default
    _highlightingEnabled = initHighlighter;
    if (initHighlighter) {
        _highlighter = new MarkdownHighlighter(document());
    }

    QFont font = this->font();

    // set the tab stop to the width of 4 spaces in the editor
    constexpr int tabStop = 4;
    QFontMetrics metrics(font);

#if QT_VERSION < QT_VERSION_CHECK(5, 11, 0)
    setTabStopWidth(tabStop * metrics.width(' '));
#else
    setTabStopDistance(tabStop * metrics.horizontalAdvance(QLatin1Char(' ')));
#endif

    // add shortcuts for duplicating text
    //    new QShortcut( QKeySequence( "Ctrl+D" ), this, SLOT( duplicateText() )
    //    ); new QShortcut( QKeySequence( "Ctrl+Alt+Down" ), this, SLOT(
    //    duplicateText() ) );

    // add a layout to the widget
    auto *layout = new QVBoxLayout(this);
    layout->setContentsMargins(0, 0, 0, 0);
    layout->addStretch();
    this->setLayout(layout);

    // add the hidden search widget
    _searchWidget = new QPlainTextEditSearchWidget(this);
    this->layout()->addWidget(_searchWidget);

    connect(this, &QPlainTextEdit::textChanged, this,
            &QMarkdownTextEdit::adjustRightMargin);
    connect(this, &QPlainTextEdit::cursorPositionChanged, this,
            &QMarkdownTextEdit::centerTheCursor);
    connect(verticalScrollBar(), &QScrollBar::valueChanged, this, [this](int) {
        _lineNumArea->update();
    });
    connect(this, &QPlainTextEdit::cursorPositionChanged, this, [this]() {
        _lineNumArea->update();

        auto oldArea = blockBoundingGeometry(_textCursor.block()).translated(contentOffset());
        _textCursor = textCursor();
        auto newArea = blockBoundingGeometry(_textCursor.block()).translated(contentOffset());
        auto areaToUpdate = oldArea | newArea;
        viewport()->update(areaToUpdate.toRect());
    });
    connect(document(), &QTextDocument::blockCountChanged,
            this, &QMarkdownTextEdit::updateLineNumberAreaWidth);
    connect(this, &QPlainTextEdit::updateRequest,
            this, &QMarkdownTextEdit::updateLineNumberArea);

    updateSettings();

    // workaround for disabled signals up initialization
    QTimer::singleShot(300, this, &QMarkdownTextEdit::adjustRightMargin);
}